

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool IsFilePath(ctmbstr path)

{
  char cVar1;
  char cVar2;
  char *p;
  char *pcVar3;
  
  cVar2 = *path;
  if (cVar2 == '\0') {
    cVar1 = '\0';
  }
  else {
    pcVar3 = path + 1;
    cVar1 = '\0';
    do {
      if (cVar1 == '\x02') {
        cVar1 = (cVar2 != '/') * '\x02' + '\x01';
      }
      else if (cVar1 == '\x01') {
        if (cVar2 == '/') {
          cVar1 = '\x02';
        }
      }
      else if ((cVar1 == '\0') && (cVar2 == ':')) {
        cVar1 = '\x01';
      }
      cVar2 = *pcVar3;
    } while ((cVar2 != '\0') && (pcVar3 = pcVar3 + 1, cVar1 != '\x03'));
  }
  return (Bool)(cVar1 == '\0' || cVar1 == '\x03');
}

Assistant:

static Bool IsFilePath( ctmbstr path )
{
    const char *p = path;
    char c;
    typedef enum states { initial, protocol_found, slash_found, file_found } states;
    states state = initial;

    while ( ( c = *p++ ) != 0 && state != file_found )
    {
        switch ( state )
        {
            case initial:
                if ( c == ':' )
                    state = protocol_found;
                break;

            case protocol_found:
                if ( c =='/' )
                    state = slash_found;
                break;

            case slash_found:
                if ( c =='/' )
                    state = protocol_found;
                else
                    state = file_found;
                break;
                
            default:
                break;
        }
        
    }
    
    return state == file_found || state == initial;
}